

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

int32_t ucnv_convert_63(char *toConverterName,char *fromConverterName,char *target,
                       int32_t targetCapacity,char *source,int32_t sourceLength,
                       UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UConverter *inConverter;
  UConverter *outConverter;
  int32_t iVar2;
  UConverter out;
  UConverter in;
  UConverter local_270;
  UConverter local_150;
  
  iVar2 = 0;
  iVar1 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (iVar1 = iVar2, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR))
  {
    if ((targetCapacity < 0) ||
       (((source == (char *)0x0 || (sourceLength < -1)) ||
        (target == (char *)0x0 && 0 < targetCapacity)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if ((sourceLength == 0) || ((sourceLength < 0 && (*source == '\0')))) {
        iVar1 = u_terminateChars_63(target,targetCapacity,0,pErrorCode);
        return iVar1;
      }
      inConverter = ucnv_createConverter_63(&local_150,fromConverterName,pErrorCode);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        outConverter = ucnv_createConverter_63(&local_270,toConverterName,pErrorCode);
        iVar1 = 0;
        if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar1 = ucnv_internalConvert
                            (outConverter,inConverter,target,targetCapacity,source,sourceLength,
                             pErrorCode);
          ucnv_close_63(inConverter);
          inConverter = outConverter;
        }
        ucnv_close_63(inConverter);
      }
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_convert(const char *toConverterName, const char *fromConverterName,
             char *target, int32_t targetCapacity,
             const char *source, int32_t sourceLength,
             UErrorCode *pErrorCode) {
    UConverter in, out; /* stack-allocated */
    UConverter *inConverter, *outConverter;
    int32_t targetLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if( source==NULL || sourceLength<-1 ||
        targetCapacity<0 || (targetCapacity>0 && target==NULL)
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* if there is no input data, we're done */
    if(sourceLength==0 || (sourceLength<0 && *source==0)) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    /* create the converters */
    inConverter=ucnv_createConverter(&in, fromConverterName, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }

    outConverter=ucnv_createConverter(&out, toConverterName, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        ucnv_close(inConverter);
        return 0;
    }

    targetLength=ucnv_internalConvert(outConverter, inConverter,
                                      target, targetCapacity,
                                      source, sourceLength,
                                      pErrorCode);

    ucnv_close(inConverter);
    ucnv_close(outConverter);

    return targetLength;
}